

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O0

void summaryindex::doit(string *path,
                       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                       *eventtoperiods)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  iterator iVar4;
  bool bVar5;
  char *pcVar6;
  DIR *__dirp;
  dirent *pdVar7;
  ulong uVar8;
  long lVar9;
  FILE *pFVar10;
  undefined8 uVar11;
  pointer ppVar12;
  reference plVar13;
  bool local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8 [32];
  _Base_ptr local_1b8;
  longlong *local_1b0;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_1a8;
  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_> local_1a0;
  iterator v_iter;
  _Self local_190;
  iterator s_iter;
  uint local_164;
  int max_summary_id;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  iterator iter;
  FILE *fout;
  string filename;
  FILE *fidx;
  string s3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [8];
  string s2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0 [39];
  allocator local_a9;
  string local_a8 [8];
  string s;
  int local_74;
  int file_index;
  dirent *ent;
  DIR *dir;
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  summaryfileperiod_to_offset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *eventtoperiods_local;
  string *path_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::map((map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
         *)&dir);
  local_74 = 0;
  pcVar6 = (char *)std::__cxx11::string::c_str();
  __dirp = opendir(pcVar6);
  pFVar10 = _stderr;
  if (__dirp == (DIR *)0x0) {
    uVar11 = std::__cxx11::string::c_str();
    fprintf(pFVar10,"Unable to open directory %s\n",uVar11);
    exit(-1);
  }
  while (pdVar7 = readdir(__dirp), pdVar7 != (dirent *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pdVar7->d_name,&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    uVar8 = std::__cxx11::string::length();
    local_1f9 = false;
    if (4 < uVar8) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_d0,(ulong)local_a8);
      local_1f9 = std::operator==(local_d0,".bin");
      std::__cxx11::string::~string((string *)local_d0);
    }
    if (local_1f9 != false) {
      std::operator+(local_f8,(char *)path);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (value_type *)local_a8);
      std::__cxx11::string::string((string *)&fidx,(string *)local_f8);
      lVar9 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)&fidx,lVar9 - 4);
      std::__cxx11::string::operator+=((string *)&fidx,".idx");
      pcVar6 = (char *)std::__cxx11::string::c_str();
      pFVar10 = fopen(pcVar6,"r");
      if (pFVar10 == (FILE *)0x0) {
        indexevents(local_f8,(map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                              *)&dir,local_74,eventtoperiods);
      }
      else {
        fclose(pFVar10);
        indexevents(local_f8,(string *)&fidx,
                    (map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                     *)&dir,local_74,eventtoperiods);
      }
      local_74 = local_74 + 1;
      std::__cxx11::string::~string((string *)&fidx);
      std::__cxx11::string::~string((string *)local_f8);
    }
    std::__cxx11::string::~string(local_a8);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fout,
                 (char *)path);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iter._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fopen(pcVar6,"wb");
  pFVar10 = _stderr;
  if ((FILE *)iter._M_current == (FILE *)0x0) {
    uVar11 = std::__cxx11::string::c_str();
    fprintf(pFVar10,"%s: cannot open %s\n","doit",uVar11);
    exit(1);
  }
  local_150._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  while( true ) {
    local_158._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar5 = __gnu_cxx::operator!=(&local_150,&local_158);
    iVar4 = iter;
    if (!bVar5) break;
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator->(&local_150);
    uVar11 = std::__cxx11::string::c_str();
    fprintf((FILE *)iVar4._M_current,"%s\n",uVar11);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_150,0);
  }
  fclose((FILE *)iter._M_current);
  local_164 = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s_iter,
                 (char *)path);
  std::__cxx11::string::operator=((string *)&fout,(string *)&s_iter);
  std::__cxx11::string::~string((string *)&s_iter);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iter._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fopen(pcVar6,"wb");
  pFVar10 = _stderr;
  if ((FILE *)iter._M_current == (FILE *)0x0) {
    uVar11 = std::__cxx11::string::c_str();
    fprintf(pFVar10,"%s: cannot open %s\n","doit",uVar11);
    exit(1);
  }
  local_190._M_node =
       (_Base_ptr)
       std::
       map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
       ::begin((map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                *)&dir);
  while( true ) {
    v_iter._M_current =
         (longlong *)
         std::
         map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
         ::end((map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
                *)&dir);
    bVar5 = std::operator!=(&local_190,(_Self *)&v_iter);
    if (!bVar5) break;
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
              ::operator->(&local_190);
    if ((int)local_164 < (ppVar12->first).summary_id) {
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_190);
      local_164 = (ppVar12->first).summary_id;
    }
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
              ::operator->(&local_190);
    local_1a0._M_current =
         (longlong *)std::vector<long_long,_std::allocator<long_long>_>::begin(&ppVar12->second);
    while( true ) {
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_190);
      local_1a8._M_current =
           (longlong *)std::vector<long_long,_std::allocator<long_long>_>::end(&ppVar12->second);
      bVar5 = __gnu_cxx::operator!=(&local_1a0,&local_1a8);
      iVar4 = iter;
      if (!bVar5) break;
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_190);
      uVar1 = (ppVar12->first).summary_id;
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_190);
      uVar2 = (ppVar12->first).fileindex;
      ppVar12 = std::
                _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator->(&local_190);
      uVar3 = (ppVar12->first).period_no;
      plVar13 = __gnu_cxx::
                __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                ::operator*(&local_1a0);
      fprintf((FILE *)iVar4._M_current,"%d, %d, %d, %lld\n",(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,
              *plVar13);
      local_1b0 = (longlong *)
                  __gnu_cxx::
                  __normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                  ::operator++(&local_1a0,0);
    }
    local_1b8 = (_Base_ptr)
                std::
                _Rb_tree_iterator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>
                ::operator++(&local_190,0);
  }
  fclose((FILE *)iter._M_current);
  std::operator+(local_1d8,(char *)path);
  std::__cxx11::string::operator=((string *)&fout,(string *)local_1d8);
  std::__cxx11::string::~string((string *)local_1d8);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  iter._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)fopen(pcVar6,"wb");
  pFVar10 = _stderr;
  if ((FILE *)iter._M_current == (FILE *)0x0) {
    uVar11 = std::__cxx11::string::c_str();
    fprintf(pFVar10,"%s: cannot open %s\n","doit",uVar11);
    exit(1);
  }
  fprintf((FILE *)iter._M_current,"%d",(ulong)local_164);
  fclose((FILE *)iter._M_current);
  std::__cxx11::string::~string((string *)&fout);
  std::
  map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
  ::~map((map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
          *)&dir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&summaryfileperiod_to_offset._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void doit(const std::string& path, const std::map<int, std::vector<int>> &eventtoperiods)
{	
	std::vector<std::string> files;
	std::map<summary_period, std::vector<long long>> summaryfileperiod_to_offset;
	DIR* dir;
	struct dirent* ent;
	int file_index = 0;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				std::string s2 = path + ent->d_name;
				files.push_back(s);
				std::string s3 = s2;
				s3.erase(s2.length() - 4);
				s3 += ".idx";
				FILE * fidx = fopen(s3.c_str(), "r");
				if (fidx == nullptr) {
					indexevents(s2, summaryfileperiod_to_offset, file_index, eventtoperiods);
				} else {
					fclose(fidx);
					indexevents(s2, s3, summaryfileperiod_to_offset, file_index, eventtoperiods);
				}
				file_index++;
			}
		}
	}
	else {
		fprintf(stderr, "Unable to open directory %s\n", path.c_str());
		exit(-1);
	}

	std::string filename =  path + "filelist.idx";
	FILE* fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	auto iter = files.begin();
	while (iter != files.end()) {
		fprintf(fout, "%s\n", iter->c_str());
		iter++;
	}

	fclose(fout);

	int max_summary_id = 0;
	filename = path + "summaries.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}

	auto s_iter = summaryfileperiod_to_offset.begin();
	while (s_iter != summaryfileperiod_to_offset.end()) {
		if (s_iter->first.summary_id > max_summary_id) max_summary_id = s_iter->first.summary_id;
		auto v_iter = s_iter->second.begin();
		while (v_iter != s_iter->second.end()) {
			fprintf(fout, "%d, %d, %d, %lld\n", s_iter->first.summary_id, s_iter->first.fileindex, s_iter->first.period_no, *v_iter);
			v_iter++;
		}
		s_iter++;
	}
	fclose(fout);

	filename = path + "max_summary_id.idx";
	fout = fopen(filename.c_str(), "wb");
	if (fout == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, filename.c_str());
		exit(EXIT_FAILURE);
	}
	fprintf(fout, "%d", max_summary_id);
	fclose(fout);
	
}